

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoSimdSplat<wabt::interp::Simd<unsigned_int,(unsigned_char)4>,unsigned_int>
          (Thread *this)

{
  uint __tmp;
  uint uVar1;
  Simd<unsigned_int,_(unsigned_char)__x04_> value;
  
  uVar1 = Pop<unsigned_int>(this);
  value.v[2] = uVar1;
  value.v[3] = uVar1;
  value.v[0] = uVar1;
  value.v[1] = uVar1;
  Push<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdSplat() {
  auto val = Pop<T>();
  R result;
  std::fill(std::begin(result.v), std::end(result.v), val);
  Push(result);
  return RunResult::Ok;
}